

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer-from-check.c
# Opt level: O2

int run_test_timer_from_check(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_prepare_init(uVar2,&prepare_handle);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_check_init(uVar2,&check_handle);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_check_start(&check_handle,check_cb);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        uVar2 = uv_default_loop();
        iVar1 = uv_timer_init(uVar2,&timer_handle);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            uVar2 = uv_default_loop();
            iVar1 = uv_run(uVar2,0);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = 1;
              eval_b = (int64_t)prepare_cb_called;
              if (eval_b == 1) {
                eval_a = 1;
                eval_b = (int64_t)check_cb_called;
                if (eval_b == 1) {
                  eval_a = 1;
                  eval_b = (int64_t)timer_cb_called;
                  if (eval_b == 1) {
                    uv_close(&prepare_handle,0);
                    uv_close(&check_handle,0);
                    uv_close(&timer_handle,0);
                    uVar2 = uv_default_loop();
                    iVar1 = uv_run(uVar2,1);
                    eval_a = (int64_t)iVar1;
                    eval_b = 0;
                    if (eval_a == 0) {
                      uVar2 = uv_default_loop();
                      uv_walk(uVar2,close_walk_cb,0);
                      uv_run(uVar2,0);
                      eval_a = 0;
                      uVar2 = uv_default_loop();
                      iVar1 = uv_loop_close(uVar2);
                      eval_b = (int64_t)iVar1;
                      if (eval_b == 0) {
                        uv_library_shutdown();
                        return 0;
                      }
                      pcVar4 = "uv_loop_close(uv_default_loop())";
                      pcVar3 = "0";
                      uVar2 = 0x4e;
                    }
                    else {
                      pcVar4 = "0";
                      pcVar3 = "uv_run(uv_default_loop(), UV_RUN_ONCE)";
                      uVar2 = 0x4d;
                    }
                  }
                  else {
                    pcVar4 = "timer_cb_called";
                    pcVar3 = "1";
                    uVar2 = 0x49;
                  }
                }
                else {
                  pcVar4 = "check_cb_called";
                  pcVar3 = "1";
                  uVar2 = 0x48;
                }
              }
              else {
                pcVar4 = "prepare_cb_called";
                pcVar3 = "1";
                uVar2 = 0x47;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
              uVar2 = 0x46;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "uv_timer_start(&timer_handle, timer_cb, 50, 0)";
            uVar2 = 0x45;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_timer_init(uv_default_loop(), &timer_handle)";
          uVar2 = 0x44;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "uv_check_start(&check_handle, check_cb)";
        uVar2 = 0x43;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "uv_check_init(uv_default_loop(), &check_handle)";
      uVar2 = 0x42;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_prepare_init(uv_default_loop(), &prepare_handle)";
    uVar2 = 0x41;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer-from-check.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(timer_from_check) {
  ASSERT_OK(uv_prepare_init(uv_default_loop(), &prepare_handle));
  ASSERT_OK(uv_check_init(uv_default_loop(), &check_handle));
  ASSERT_OK(uv_check_start(&check_handle, check_cb));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_timer_start(&timer_handle, timer_cb, 50, 0));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, prepare_cb_called);
  ASSERT_EQ(1, check_cb_called);
  ASSERT_EQ(1, timer_cb_called);
  uv_close((uv_handle_t*) &prepare_handle, NULL);
  uv_close((uv_handle_t*) &check_handle, NULL);
  uv_close((uv_handle_t*) &timer_handle, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_ONCE));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}